

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O3

int ddUpdateMtrTree(DdManager *table,MtrNode *treenode,int *perm,int *invperm)

{
  MtrHalfWord MVar1;
  int iVar2;
  uint uVar3;
  int *invperm_00;
  MtrHalfWord MVar4;
  int iVar5;
  uint uVar6;
  MtrHalfWord MVar7;
  MtrHalfWord MVar8;
  MtrHalfWord *pMVar9;
  
  iVar5 = 1;
  if (treenode != (MtrNode *)0x0) {
    uVar3 = treenode->low;
    invperm_00 = (int *)(ulong)uVar3;
    uVar6 = treenode->size + uVar3;
    iVar5 = 0;
    if (uVar3 < uVar6) {
      pMVar9 = (MtrHalfWord *)(table->invperm + (int)uVar3);
      MVar4 = 0x7fffffff;
      MVar8 = 0;
      MVar7 = 0xffffffff;
      do {
        MVar1 = perm[(int)*pMVar9];
        if ((int)MVar1 < (int)MVar4) {
          MVar7 = *pMVar9;
          MVar4 = MVar1;
        }
        if ((int)MVar8 < (int)MVar1) {
          MVar8 = MVar1;
        }
        pMVar9 = pMVar9 + 1;
        uVar3 = (int)invperm_00 + 1;
        invperm_00 = (int *)(ulong)uVar3;
      } while (uVar3 < uVar6);
      iVar5 = 0;
      if ((MVar7 != 0xffffffff) && ((MVar8 - MVar4) + 1 == treenode->size)) {
        treenode->low = MVar4;
        treenode->index = MVar7;
        if (((treenode->child == (MtrNode *)0x0) ||
            (iVar2 = ddUpdateMtrTree(table,treenode->child,perm,invperm_00), iVar2 != 0)) &&
           ((treenode->younger == (MtrNode *)0x0 ||
            (iVar2 = ddUpdateMtrTree(table,treenode->younger,perm,invperm_00), iVar2 != 0)))) {
          iVar5 = 1;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int
ddUpdateMtrTree(
  DdManager * table,
  MtrNode * treenode,
  int * perm,
  int * invperm)
{
    int i, size;
    int index, level, minLevel, maxLevel, minIndex;

    if (treenode == NULL) return(1);

    minLevel = CUDD_MAXINDEX;
    maxLevel = 0;
    minIndex = -1;
    /* i : level */
    for (i = treenode->low; i < treenode->low + treenode->size; i++) {
        index = table->invperm[i];
        level = perm[index];
        if (level < minLevel) {
            minLevel = level;
            minIndex = index;
        }
        if (level > maxLevel)
            maxLevel = level;
    }
    size = maxLevel - minLevel + 1;
    if (minIndex == -1) return(0);
    if (size == treenode->size) {
        treenode->low = minLevel;
        treenode->index = minIndex;
    } else {
        return(0);
    }

    if (treenode->child != NULL) {
        if (!ddUpdateMtrTree(table, treenode->child, perm, invperm))
            return(0);
    }
    if (treenode->younger != NULL) {
        if (!ddUpdateMtrTree(table, treenode->younger, perm, invperm))
            return(0);
    }
    return(1);
}